

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_deriveSeqStoreChunk
               (seqStore_t *resultSeqStore,seqStore_t *originalSeqStore,size_t startIdx,
               size_t endIdx)

{
  BYTE *pBVar1;
  seqDef *psVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  seqStore_t *psVar6;
  seqStore_t *psVar7;
  BYTE *pBVar8;
  
  pBVar1 = originalSeqStore->lit;
  psVar6 = originalSeqStore;
  psVar7 = resultSeqStore;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    psVar7->sequencesStart = psVar6->sequencesStart;
    psVar6 = (seqStore_t *)&psVar6->sequences;
    psVar7 = (seqStore_t *)&psVar7->sequences;
  }
  if (startIdx == 0) {
    sVar3 = 0;
  }
  else {
    resultSeqStore->sequences = originalSeqStore->sequencesStart + startIdx;
    sVar3 = ZSTD_countSeqStoreLiteralsBytes(resultSeqStore);
  }
  if (originalSeqStore->longLengthType != ZSTD_llt_none) {
    if (originalSeqStore->longLengthPos < startIdx || endIdx < originalSeqStore->longLengthPos) {
      resultSeqStore->longLengthType = ZSTD_llt_none;
    }
    else {
      resultSeqStore->longLengthPos = resultSeqStore->longLengthPos - (int)startIdx;
    }
  }
  resultSeqStore->sequencesStart = originalSeqStore->sequencesStart + startIdx;
  psVar2 = originalSeqStore->sequencesStart;
  resultSeqStore->sequences = psVar2 + endIdx;
  sVar4 = ZSTD_countSeqStoreLiteralsBytes(resultSeqStore);
  pBVar8 = resultSeqStore->litStart;
  resultSeqStore->litStart = pBVar8 + sVar3;
  pBVar8 = pBVar8 + sVar3 + sVar4;
  if ((long)originalSeqStore->sequences - (long)psVar2 >> 3 == endIdx) {
    pBVar8 = pBVar1;
  }
  resultSeqStore->lit = pBVar8;
  resultSeqStore->llCode = resultSeqStore->llCode + startIdx;
  resultSeqStore->mlCode = resultSeqStore->mlCode + startIdx;
  resultSeqStore->ofCode = resultSeqStore->ofCode + startIdx;
  return;
}

Assistant:

static void ZSTD_deriveSeqStoreChunk(seqStore_t* resultSeqStore,
                               const seqStore_t* originalSeqStore,
                                     size_t startIdx, size_t endIdx) {
    BYTE* const litEnd = originalSeqStore->lit;
    size_t literalsBytes;
    size_t literalsBytesPreceding = 0;

    *resultSeqStore = *originalSeqStore;
    if (startIdx > 0) {
        resultSeqStore->sequences = originalSeqStore->sequencesStart + startIdx;
        literalsBytesPreceding = ZSTD_countSeqStoreLiteralsBytes(resultSeqStore);
    }

    /* Move longLengthPos into the correct position if necessary */
    if (originalSeqStore->longLengthType != ZSTD_llt_none) {
        if (originalSeqStore->longLengthPos < startIdx || originalSeqStore->longLengthPos > endIdx) {
            resultSeqStore->longLengthType = ZSTD_llt_none;
        } else {
            resultSeqStore->longLengthPos -= (U32)startIdx;
        }
    }
    resultSeqStore->sequencesStart = originalSeqStore->sequencesStart + startIdx;
    resultSeqStore->sequences = originalSeqStore->sequencesStart + endIdx;
    literalsBytes = ZSTD_countSeqStoreLiteralsBytes(resultSeqStore);
    resultSeqStore->litStart += literalsBytesPreceding;
    if (endIdx == (size_t)(originalSeqStore->sequences - originalSeqStore->sequencesStart)) {
        /* This accounts for possible last literals if the derived chunk reaches the end of the block */
        resultSeqStore->lit = litEnd;
    } else {
        resultSeqStore->lit = resultSeqStore->litStart+literalsBytes;
    }
    resultSeqStore->llCode += startIdx;
    resultSeqStore->mlCode += startIdx;
    resultSeqStore->ofCode += startIdx;
}